

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.hpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::GridGlobal
          (GridGlobal *this,AccelerationContext *acc,int cnum_dimensions,int cnum_outputs,int depth,
          TypeDepth type,TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          double calpha,double cbeta,char *custom_filename,
          vector<int,_std::allocator<int>_> *level_limits)

{
  (this->super_BaseCanonicalGrid).acceleration = acc;
  (this->super_BaseCanonicalGrid).points.cache_num_indexes = 0;
  (this->super_BaseCanonicalGrid).num_dimensions = 0;
  (this->super_BaseCanonicalGrid).num_outputs = 0;
  (this->super_BaseCanonicalGrid).points.num_dimensions = 0;
  (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseCanonicalGrid).needed.num_dimensions = 0;
  (this->super_BaseCanonicalGrid).needed.cache_num_indexes = 0;
  (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BaseCanonicalGrid).needed.indexes.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseCanonicalGrid).values.num_outputs = 0;
  (this->super_BaseCanonicalGrid).values.num_values = 0;
  (this->super_BaseCanonicalGrid).values.values.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_BaseCanonicalGrid).values.values.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_BaseCanonicalGrid).values.values.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridGlobal_001ff1c0;
  (this->wrapper).isNonNested = false;
  (this->wrapper).num_levels = 0;
  (this->wrapper).rule = rule_none;
  (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->custom).num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->custom).precision.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->custom).nodes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->custom).nodes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->custom).nodes.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->custom).weights.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->custom).weights.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->custom).weights.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memset(&(this->wrapper).num_points,0,0xb4);
  (this->active_tensors).cache_num_indexes = 0;
  (this->tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->active_tensors).num_dimensions = 0;
  (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tensor_refs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tensor_refs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tensor_refs).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->updated_tensors).num_dimensions + 4) = 0;
  (this->updated_active_tensors).cache_num_indexes = 0;
  (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->updated_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->updated_active_tensors).num_dimensions = 0;
  (this->updated_active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->updated_active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->updated_active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->updated_active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->updated_active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->updated_active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->custom).num_levels = 0;
  (this->custom).description._M_dataplus._M_p = (pointer)&(this->custom).description.field_2;
  (this->custom).description._M_string_length = 0;
  (this->custom).description.field_2._M_local_buf[0] = '\0';
  (this->dynamic_values)._M_t.
  super___uniq_ptr_impl<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
  .super__Head_base<0UL,_TasGrid::DynamicConstructorDataGlobal_*,_false>._M_head_impl =
       (DynamicConstructorDataGlobal *)0x0;
  (this->gpu_cache)._M_t.
  super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl =
       (CudaGlobalData<double> *)0x0;
  (this->gpu_cachef)._M_t.
  super___uniq_ptr_impl<TasGrid::CudaGlobalData<float>,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<float>_*,_std::default_delete<TasGrid::CudaGlobalData<float>_>_>
  .super__Head_base<0UL,_TasGrid::CudaGlobalData<float>_*,_false>._M_head_impl =
       (CudaGlobalData<float> *)0x0;
  makeGrid(this,cnum_dimensions,cnum_outputs,depth,type,crule,anisotropic_weights,calpha,cbeta,
           custom_filename,level_limits);
  return;
}

Assistant:

GridGlobal(AccelerationContext const *acc, int cnum_dimensions, int cnum_outputs, int depth, TypeDepth type, TypeOneDRule crule, const std::vector<int> &anisotropic_weights, double calpha, double cbeta, const char* custom_filename, const std::vector<int> &level_limits) : BaseCanonicalGrid(acc){
        makeGrid(cnum_dimensions, cnum_outputs, depth, type, crule, anisotropic_weights, calpha, cbeta, custom_filename, level_limits);
    }